

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void print_all_live_ranges(gen_ctx_t gen_ctx)

{
  void **ppvVar1;
  MIR_context_t ctx;
  FILE *pFVar2;
  lr_ctx *plVar3;
  void *pvVar4;
  gen_ctx_t bm;
  bitmap_t pVVar5;
  ulong uVar6;
  lr_bb_t_conflict *pplVar7;
  int iVar8;
  MIR_type_t tp;
  VARR_live_range_t *pVVar9;
  FILE *__s;
  live_range_t_conflict plVar10;
  uint uVar11;
  live_range_t plVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  uint start;
  ulong uVar13;
  live_range_t_conflict plVar14;
  live_range_t_conflict nb;
  size_t nb_00;
  char *pcVar15;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t pgVar16;
  int iVar17;
  undefined8 in_R8;
  ulong uVar18;
  MIR_reg_t reg;
  
  ctx = gen_ctx->ctx;
  __s = (FILE *)gen_ctx->debug_file;
  pcVar15 = "+++++++++++++Live ranges:\n";
  plVar14 = (live_range_t_conflict)0x1a;
  fwrite("+++++++++++++Live ranges:\n",0x1a,1,__s);
  pVVar9 = gen_ctx->lr_ctx->var_live_ranges;
  if (pVVar9 != (VARR_live_range_t *)0x0) {
    uVar13 = 0;
    do {
      iVar8 = (int)in_R8;
      uVar11 = (uint)__s;
      if (pVVar9->els_num <= uVar13) {
        return;
      }
      if (pVVar9->varr == (live_range_t_conflict *)0x0) {
        print_all_live_ranges_cold_1();
        plVar3 = ((gen_ctx_t)pcVar15)->lr_ctx;
        pVVar9 = plVar3->var_live_ranges;
        iVar17 = iVar8;
        if (((pVVar9 == (VARR_live_range_t *)0x0) || (pVVar9->varr == (live_range_t_conflict *)0x0))
           || (uVar13 = (ulong)plVar14 & 0xffffffff, pVVar9->els_num <= uVar13)) {
          make_var_live_cold_4();
LAB_0016fd23:
          make_var_live_cold_2();
          nb = plVar14;
          gen_ctx_00 = (gen_ctx_t)pcVar15;
LAB_0016fd28:
          make_var_live_cold_3();
        }
        else {
          plVar10 = pVVar9->varr[uVar13];
          if ((iVar8 == 0) || (plVar3->scan_vars_num != 0)) {
LAB_0016fc60:
            pgVar16 = (gen_ctx_t)((gen_ctx_t)pcVar15)->lr_ctx->live_vars;
            uVar18 = (ulong)extraout_EDX;
            nb = (live_range_t_conflict)(uVar18 + 1);
            gen_ctx_00 = pgVar16;
            bitmap_expand((bitmap_t)pgVar16,(size_t)nb);
            if (pgVar16 != (gen_ctx_t)0x0) {
              pvVar4 = (&pgVar16->curr_func_item->data)[uVar18 >> 6];
              (&pgVar16->curr_func_item->data)[uVar18 >> 6] =
                   (void *)((ulong)pvVar4 | 1L << (uVar18 & 0x3f));
              if ((((ulong)pvVar4 >> (uVar18 & 0x3f) & 1) != 0) ||
                 (((iVar8 != 0 && (plVar10 != (live_range_t_conflict)0x0)) &&
                  ((plVar10->lr_bb == (lr_bb_t_conflict)0x0 &&
                   (plVar10->finish + 1U == uVar11 || plVar10->finish == uVar11)))))) {
                return;
              }
              pVVar9 = ((gen_ctx_t)pcVar15)->lr_ctx->var_live_ranges;
              plVar14 = (live_range_t_conflict)(ulong)uVar11;
              plVar10 = create_live_range((gen_ctx_t)pcVar15,uVar11,-1,plVar10);
              if (((pVVar9 != (VARR_live_range_t *)0x0) &&
                  (pVVar9->varr != (live_range_t_conflict *)0x0)) && (uVar13 < pVVar9->els_num)) {
                pVVar9->varr[uVar13] = plVar10;
                return;
              }
              goto LAB_0016fd23;
            }
            goto LAB_0016fd28;
          }
          pgVar16 = (gen_ctx_t)plVar3->referenced_vars;
          nb = (live_range_t_conflict)(uVar13 + 1);
          gen_ctx_00 = pgVar16;
          bitmap_expand((bitmap_t)pgVar16,(size_t)nb);
          if (pgVar16 != (gen_ctx_t)0x0) {
            ppvVar1 = &pgVar16->curr_func_item->data + (uVar13 >> 6);
            *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)plVar14 & 0x3f));
            goto LAB_0016fc60;
          }
        }
        make_var_live_cold_1();
        if (gen_ctx_00->lr_ctx->scan_vars_num == 0) {
          return;
        }
        if ((int)nb < 0) {
LAB_0016fd6b:
          __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
        }
        plVar12 = (live_range_t)gen_ctx_00->lr_ctx->scan_var_to_var_map;
        if (plVar12 == (live_range_t)0x0) {
          scan_var_to_var_cold_2();
        }
        else {
          pplVar7 = &plVar12->lr_bb;
          if ((int)*pplVar7 <= (int)nb) goto LAB_0016fd6b;
          plVar12 = *(live_range_t *)&plVar12->ref_cost;
          if ((plVar12 != (live_range_t)0x0) &&
             ((lr_bb_t_conflict)((ulong)nb & 0xffffffff) < *pplVar7)) {
            return;
          }
        }
        scan_var_to_var_cold_1();
        uVar11 = (uint)nb;
        start = (uint)plVar12;
        uVar13 = (ulong)nb & 0xffffffff;
        pgVar16 = gen_ctx_00;
        if ((iVar17 != 0) && (gen_ctx_00->lr_ctx->scan_vars_num == 0)) {
          bm = (gen_ctx_t)gen_ctx_00->lr_ctx->referenced_vars;
          nb_00 = uVar13 + 1;
          pgVar16 = bm;
          bitmap_expand((bitmap_t)bm,nb_00);
          uVar11 = (uint)nb_00;
          if (bm == (gen_ctx_t)0x0) goto LAB_0016fe7f;
          plVar12 = (live_range_t)(uVar13 >> 6);
          ppvVar1 = &bm->curr_func_item->data + (long)plVar12;
          *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)nb & 0x3f));
        }
        pVVar9 = gen_ctx_00->lr_ctx->var_live_ranges;
        if (((pVVar9 == (VARR_live_range_t *)0x0) ||
            (plVar12 = (live_range_t)pVVar9->varr, plVar12 == (live_range_t)0x0)) ||
           (pVVar9->els_num <= uVar13)) {
          make_var_dead_cold_4();
LAB_0016fe75:
          make_var_dead_cold_2();
        }
        else {
          pVVar5 = gen_ctx_00->lr_ctx->live_vars;
          if (pVVar5 != (bitmap_t)0x0) {
            plVar14 = (live_range_t_conflict)(&plVar12->lr_bb)[uVar13];
            uVar18 = (ulong)extraout_EDX_00;
            if ((uVar18 < pVVar5->els_num << 6) &&
               (uVar6 = pVVar5->varr[uVar18 >> 6],
               pVVar5->varr[uVar18 >> 6] = uVar6 & ~(1L << (uVar18 & 0x3f)),
               (uVar6 >> (uVar18 & 0x3f) & 1) != 0)) {
              plVar14->finish = start;
              return;
            }
            uVar11 = start;
            plVar14 = create_live_range(gen_ctx_00,start,start,plVar14);
            plVar12 = (live_range_t)pVVar9->varr;
            pgVar16 = gen_ctx_00;
            if ((plVar12 != (live_range_t)0x0) && (uVar13 < pVVar9->els_num)) {
              (&plVar12->lr_bb)[uVar13] = (lr_bb_t_conflict)plVar14;
              return;
            }
            goto LAB_0016fe75;
          }
        }
        make_var_dead_cold_3();
LAB_0016fe7f:
        make_var_dead_cold_1();
        plVar14 = pgVar16->lr_ctx->free_lr_list;
        if (plVar14 == (live_range_t_conflict)0x0) {
          plVar14 = (live_range_t_conflict)malloc(0x20);
          if (plVar14 == (live_range_t_conflict)0x0) {
            util_error(pgVar16,"no memory");
          }
        }
        else {
          pgVar16->lr_ctx->free_lr_list = plVar14->next;
        }
        if (-1 < (int)uVar11) {
          if (uVar11 <= extraout_EDX_01) {
            plVar14->start = uVar11;
            plVar14->finish = extraout_EDX_01;
            plVar14->ref_cost = 1;
            plVar14->next = plVar12;
            plVar14->lr_bb = (lr_bb_t_conflict)0x0;
            return;
          }
          __assert_fail("finish < 0 || start <= finish",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)")
          ;
        }
        __assert_fail("start >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
      }
      plVar10 = pVVar9->varr[uVar13];
      if (plVar10 != (live_range_t_conflict)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"%lu",uVar13);
        if (gen_ctx->lr_ctx->scan_vars_num != 0) {
          pFVar2 = (FILE *)gen_ctx->debug_file;
          iVar8 = var_to_scan_var(gen_ctx,(MIR_reg_t)uVar13);
          fprintf(pFVar2," (%lu)",(long)iVar8);
        }
        if (0x21 < uVar13) {
          pFVar2 = (FILE *)gen_ctx->debug_file;
          reg = (MIR_reg_t)uVar13 - 0x21;
          tp = MIR_reg_type(ctx,reg,(gen_ctx->curr_func_item->u).func);
          pcVar15 = MIR_type_str(ctx,tp);
          __s = (FILE *)MIR_reg_name(ctx,reg,(gen_ctx->curr_func_item->u).func);
          fprintf(pFVar2," (%s:%s)",pcVar15);
        }
        fputc(0x3a,(FILE *)gen_ctx->debug_file);
        pcVar15 = (char *)gen_ctx;
        print_live_ranges(gen_ctx,plVar10);
        plVar14 = plVar10;
      }
      uVar13 = uVar13 + 1;
      pVVar9 = gen_ctx->lr_ctx->var_live_ranges;
    } while (pVVar9 != (VARR_live_range_t *)0x0);
  }
  print_all_live_ranges_cold_2();
  return;
}

Assistant:

static void print_all_live_ranges (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  live_range_t lr;

  fprintf (debug_file, "+++++++++++++Live ranges:\n");
  for (size_t i = 0; i < VARR_LENGTH (live_range_t, var_live_ranges); i++) {
    if ((lr = VARR_GET (live_range_t, var_live_ranges, i)) == NULL) continue;
    fprintf (debug_file, "%lu", (unsigned long) i);
    if (scan_vars_num != 0)
      fprintf (debug_file, " (%lu)", (unsigned long) var_to_scan_var (gen_ctx, (MIR_reg_t) i));
    if (i > MAX_HARD_REG)
      fprintf (debug_file, " (%s:%s)",
               MIR_type_str (ctx, MIR_reg_type (ctx, (MIR_reg_t) (i - MAX_HARD_REG),
                                                curr_func_item->u.func)),
               MIR_reg_name (ctx, (MIR_reg_t) (i - MAX_HARD_REG), curr_func_item->u.func));
    fprintf (debug_file, ":");
    print_live_ranges (gen_ctx, lr);
  }
}